

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int memcmp_and_randomize(uchar *value,uchar *expected,size_t len)

{
  int iVar1;
  uint64_t uVar2;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t i;
  int ret;
  ulong uVar3;
  
  iVar1 = secp256k1_memcmp_var(in_RDI,in_RSI,in_RDX);
  for (uVar3 = 0; uVar3 < in_RDX; uVar3 = uVar3 + 1) {
    uVar2 = testrand_bits((int)(uVar3 >> 0x20));
    *(char *)((long)in_RDI + uVar3) = (char)uVar2;
  }
  return iVar1;
}

Assistant:

int memcmp_and_randomize(unsigned char *value, const unsigned char *expected, size_t len) {
    int ret;
    size_t i;
    ret = secp256k1_memcmp_var(value, expected, len);
    for (i = 0; i < len; i++) {
        value[i] = testrand_bits(8);
    }
    return ret;
}